

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAcademicGeoMesh.cpp
# Opt level: O2

TPZGeoMesh * __thiscall TPZAcademicGeoMesh::PyramidalAndTetrahedralMesh(TPZAcademicGeoMesh *this)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  TPZGeoMesh *this_00;
  long lVar4;
  long lVar5;
  int il;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int (*paiVar11) [4];
  long lVar12;
  int (*paiVar13) [5];
  int64_t index;
  TPZManVector<long,_5> elnodes;
  TPZManVector<long,_8> nodes;
  
  lVar3 = this->fNumberElements;
  uVar2 = this->fMaterialId;
  this_00 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(this_00);
  this_00->fDim = 3;
  GenerateNodes(this,this_00);
  lVar1 = lVar3 + 1;
  lVar7 = 0;
  lVar4 = 0;
  if (0 < lVar3) {
    lVar4 = lVar3;
  }
  for (; lVar7 != lVar4; lVar7 = lVar7 + 1) {
    lVar8 = 0;
    while (lVar8 != lVar3) {
      lVar10 = lVar8 * lVar1 + lVar7;
      lVar8 = lVar8 + 1;
      lVar9 = lVar8 * lVar1 + lVar7;
      lVar12 = 0;
      while (lVar12 != lVar3) {
        elnodes.super_TPZVec<long>._vptr_TPZVec = (_func_int **)0x0;
        TPZManVector<long,_8>::TPZManVector(&nodes,8,(long *)&elnodes);
        lVar5 = lVar1 * lVar1 * lVar12;
        *nodes.super_TPZVec<long>.fStore = lVar10 + lVar5;
        nodes.super_TPZVec<long>.fStore[1] = lVar10 + 1 + lVar5;
        nodes.super_TPZVec<long>.fStore[2] = lVar5 + lVar9 + 1;
        nodes.super_TPZVec<long>.fStore[3] = lVar9 + lVar5;
        lVar12 = lVar12 + 1;
        lVar5 = lVar1 * lVar1 * lVar12;
        nodes.super_TPZVec<long>.fStore[4] = lVar10 + lVar5;
        nodes.super_TPZVec<long>.fStore[5] = lVar10 + lVar5 + 1;
        nodes.super_TPZVec<long>.fStore[6] = lVar9 + 1 + lVar5;
        nodes.super_TPZVec<long>.fStore[7] = lVar9 + lVar5;
        paiVar11 = tetraedra;
        paiVar13 = pyramid;
        for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
          TPZManVector<long,_5>::TPZManVector(&elnodes,5);
          for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
            elnodes.super_TPZVec<long>.fStore[lVar6] =
                 nodes.super_TPZVec<long>.fStore[(*paiVar13)[lVar6]];
          }
          (*(this_00->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (this_00,5,&elnodes,(ulong)uVar2,&index,1);
          (*elnodes.super_TPZVec<long>._vptr_TPZVec[3])(&elnodes,4);
          for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
            elnodes.super_TPZVec<long>.fStore[lVar6] =
                 nodes.super_TPZVec<long>.fStore[(*paiVar11)[lVar6]];
          }
          (*(this_00->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (this_00,4,&elnodes,(ulong)uVar2,&index,1);
          TPZManVector<long,_5>::~TPZManVector(&elnodes);
          paiVar13 = paiVar13 + 1;
          paiVar11 = paiVar11 + 1;
        }
        TPZManVector<long,_8>::~TPZManVector(&nodes);
      }
    }
  }
  TPZGeoMesh::BuildConnectivity(this_00);
  AddBoundaryElementsByCoord(this,this_00);
  if (this->fShouldDeform != false) {
    DeformGMesh(this,this_00);
  }
  return this_00;
}

Assistant:

TPZGeoMesh *TPZAcademicGeoMesh::PyramidalAndTetrahedralMesh()
{
    int64_t nelem = fNumberElements;
    int MaterialId = fMaterialId;
    TPZGeoMesh *gmesh = new TPZGeoMesh;
    const int dim = 3;
    gmesh->SetDimension(dim);
    GenerateNodes(gmesh);
  
    for (int64_t i=0; i<nelem; i++) {
        for (int64_t j=0; j<nelem; j++) {
            for (int64_t k=0; k<nelem; k++) {
                TPZManVector<int64_t,8> nodes(8,0);
                nodes[0] = k*(nelem+1)*(nelem+1)+j*(nelem+1)+i;
                nodes[1] = k*(nelem+1)*(nelem+1)+j*(nelem+1)+i+1;
                nodes[2] = k*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i+1;
                nodes[3] = k*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i;
                nodes[4] = (k+1)*(nelem+1)*(nelem+1)+j*(nelem+1)+i;
                nodes[5] = (k+1)*(nelem+1)*(nelem+1)+j*(nelem+1)+i+1;
                nodes[6] = (k+1)*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i+1;
                nodes[7] = (k+1)*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i;
#ifdef PZ_LOG
                if(logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "Pyramid and tetrahedral nodes " << nodes;
                    LOGPZ_DEBUG(logger, sout.str())
                }
#endif
                for (int el=0; el<2; el++)
                {
                    TPZManVector<int64_t,5> elnodes(5);
                    for (int il=0; il<5; il++) {
                        elnodes[il] = nodes[pyramid[el][il]];
                    }
                    int64_t index;
                    gmesh->CreateGeoElement(EPiramide, elnodes, MaterialId, index);
                    elnodes.resize(4);
                    for (int il=0; il<4; il++) {
                        elnodes[il] = nodes[tetraedra[el][il]];
                    }
                    gmesh->CreateGeoElement(ETetraedro, elnodes, MaterialId, index);
                }
            }
        }
    }
    gmesh->BuildConnectivity();
//    AddBoundaryElements(gmesh);
    AddBoundaryElementsByCoord(gmesh);
    if (fShouldDeform) {
        DeformGMesh(*gmesh);
    }
    return gmesh;
}